

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O0

int cvLsSolve(CVodeMem cv_mem,N_Vector b,N_Vector weight,N_Vector ynow,N_Vector fnow)

{
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  CVodeMem in_RDI;
  undefined8 in_R8;
  sunrealtype resnorm;
  long nps_inc;
  int retval;
  int nli_inc;
  int curiter;
  sunrealtype w_mean;
  sunrealtype delta;
  sunrealtype deltar;
  sunrealtype bnorm;
  CVLsMem cvls_mem;
  int local_60;
  int local_5c;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  int *local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  CVodeMem local_10;
  int local_4;
  
  local_40 = 0.0;
  if (in_RDI->cv_lmem == (void *)0x0) {
    cvProcessError(in_RDI,-2,0x679,"cvLsSolve",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_ls.c"
                   ,"Linear solver memory is NULL.");
    local_4 = -2;
  }
  else {
    local_38 = (int *)in_RDI->cv_lmem;
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    SUNNonlinSolGetCurIter(in_RDI->NLS,&local_5c);
    if (*local_38 == 0) {
      local_50 = 0.0;
    }
    else {
      local_48 = *(double *)(local_38 + 0xe) * local_10->cv_tq[4];
      local_40 = (double)N_VWrmsNorm(local_18,local_20);
      if (local_40 <= local_48) {
        if (0 < local_5c) {
          N_VConst(0,local_18);
        }
        local_38[0x4e] = 0;
        return local_38[0x4e];
      }
      local_50 = local_48 * *(double *)(local_38 + 0x10);
    }
    *(undefined8 *)(local_38 + 0x1c) = local_28;
    *(undefined8 *)(local_38 + 0x1e) = local_30;
    if (*(long *)(*(long *)(*(long *)(local_38 + 0x12) + 8) + 0x20) == 0) {
      if (*local_38 != 0) {
        N_VConst(0x3ff0000000000000,*(undefined8 *)(local_38 + 0x1a));
        local_58 = (double)N_VWrmsNorm(local_20,*(undefined8 *)(local_38 + 0x1a));
        local_50 = local_50 / local_58;
      }
    }
    else {
      iVar1 = SUNLinSolSetScalingVectors(*(undefined8 *)(local_38 + 0x12),local_20,local_20);
      if (iVar1 != 0) {
        cvProcessError(local_10,-9,0x6ac,"cvLsSolve",
                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_ls.c"
                       ,"Error in calling SUNLinSolSetScalingVectors");
        local_38[0x4e] = -9;
        return local_38[0x4e];
      }
    }
    N_VConst(0,*(undefined8 *)(local_38 + 0x1a));
    iVar1 = SUNLinSolSetZeroGuess(*(undefined8 *)(local_38 + 0x12),1);
    if (iVar1 == 0) {
      if (*(long *)(local_38 + 0x40) != 0) {
        iVar1 = (**(code **)(local_38 + 0x40))
                          (local_10->cv_tn,local_28,local_30,*(undefined8 *)(local_38 + 0x46));
        local_38[0x4e] = iVar1;
        *(long *)(local_38 + 0x30) = *(long *)(local_38 + 0x30) + 1;
        if (local_38[0x4e] != 0) {
          cvProcessError(local_10,0,0x6e3,"cvLsSolve",
                         "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_ls.c"
                         ,"The Jacobian x vector setup routine failed in an unrecoverable manner.");
          return local_38[0x4e];
        }
      }
      iVar1 = SUNLinSolSolve(local_50,*(undefined8 *)(local_38 + 0x12),
                             *(undefined8 *)(local_38 + 0x14),*(undefined8 *)(local_38 + 0x1a),
                             local_18);
      N_VScale(0x3ff0000000000000,*(undefined8 *)(local_38 + 0x1a),local_18);
      if ((local_38[0xc] != 0) && ((local_10->cv_gamrat != 1.0 || (NAN(local_10->cv_gamrat))))) {
        N_VScale(2.0 / (local_10->cv_gamrat + 1.0),local_18,local_18);
      }
      local_60 = 0;
      if (*local_38 != 0) {
        if (*(long *)(*(long *)(*(long *)(local_38 + 0x12) + 8) + 0x50) != 0) {
          SUNLinSolResNorm(*(undefined8 *)(local_38 + 0x12));
        }
        if (*(long *)(*(long *)(*(long *)(local_38 + 0x12) + 8) + 0x48) != 0) {
          local_60 = SUNLinSolNumIters(*(undefined8 *)(local_38 + 0x12));
        }
      }
      *(long *)(local_38 + 0x2a) = (long)local_60 + *(long *)(local_38 + 0x2a);
      if (iVar1 != 0) {
        *(long *)(local_38 + 0x2e) = *(long *)(local_38 + 0x2e) + 1;
      }
      local_38[0x4e] = iVar1;
      if ((1 < iVar1 + 9999U) && (iVar1 != -0x2705)) {
        if (iVar1 == -0x2703) {
          cvProcessError(local_10,-0x2703,0x726,"cvLsSolve",
                         "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_ls.c"
                         ,"Failure in SUNLinSol external package");
          return -1;
        }
        if (1 < iVar1 + 0x32bU) {
          if (iVar1 == -0x328) {
            cvProcessError(local_10,-0x328,0x730,"cvLsSolve",
                           "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_ls.c"
                           ,"The preconditioner solve routine failed in an unrecoverable manner.");
            return -1;
          }
          if (iVar1 == -0x325) {
            cvProcessError(local_10,-0x325,0x72b,"cvLsSolve",
                           "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_ls.c"
                           ,"The Jacobian x vector routine failed in an unrecoverable manner.");
            return -1;
          }
          if (iVar1 == 0) {
            return 0;
          }
          if (iVar1 != 0x321) {
            if ((1 < iVar1 - 0x322U) && (3 < iVar1 - 0x325U)) {
              return 0;
            }
            return 1;
          }
          if (local_5c == 0) {
            return 0;
          }
          return 1;
        }
      }
      local_4 = -1;
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int cvLsSolve(CVodeMem cv_mem, N_Vector b, N_Vector weight, N_Vector ynow,
              N_Vector fnow)
{
  CVLsMem cvls_mem;
  sunrealtype bnorm = ZERO;
  sunrealtype deltar, delta, w_mean;
  int curiter, nli_inc, retval;

  /* only used with logging */
  SUNDIALS_MAYBE_UNUSED long int nps_inc;
  SUNDIALS_MAYBE_UNUSED sunrealtype resnorm;

  /* access CVLsMem structure */
  if (cv_mem->cv_lmem == NULL)
  {
    cvProcessError(cv_mem, CVLS_LMEM_NULL, __LINE__, __func__, __FILE__,
                   MSG_LS_LMEM_NULL);
    return (CVLS_LMEM_NULL);
  }
  cvls_mem = (CVLsMem)cv_mem->cv_lmem;

  /* get current nonlinear solver iteration */
  retval = SUNNonlinSolGetCurIter(cv_mem->NLS, &curiter);

  /* If the linear solver is iterative:
     test norm(b), if small, return x = 0 or x = b;
     set linear solver tolerance (in left/right scaled 2-norm) */
  if (cvls_mem->iterative)
  {
    deltar = cvls_mem->eplifac * cv_mem->cv_tq[4];
    bnorm  = N_VWrmsNorm(b, weight);

    SUNLogInfo(CV_LOGGER, "begin-linear-solve",
               "iterative = 1, b-norm = %.16g, b-tol = %.16g, res-tol = %.16g",
               bnorm, deltar, deltar * cvls_mem->nrmfac);

    if (bnorm <= deltar)
    {
      if (curiter > 0) { N_VConst(ZERO, b); }
      cvls_mem->last_flag = CVLS_SUCCESS;

      SUNLogInfo(CV_LOGGER, "end-linear-solve", "status = success small rhs");

      return (cvls_mem->last_flag);
    }
    /* Adjust tolerance for 2-norm */
    delta = deltar * cvls_mem->nrmfac;
  }
  else
  {
    delta = ZERO;

    SUNLogInfo(CV_LOGGER, "begin-linear-solve", "iterative = 0");
  }

  /* Set vectors ycur and fcur for use by the Atimes and Psolve
     interface routines */
  cvls_mem->ycur = ynow;
  cvls_mem->fcur = fnow;

  /* Set scaling vectors for LS to use (if applicable) */
  if (cvls_mem->LS->ops->setscalingvectors)
  {
    retval = SUNLinSolSetScalingVectors(cvls_mem->LS, weight, weight);
    if (retval != SUN_SUCCESS)
    {
      cvProcessError(cv_mem, CVLS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                     "Error in calling SUNLinSolSetScalingVectors");
      cvls_mem->last_flag = CVLS_SUNLS_FAIL;

      SUNLogInfo(CV_LOGGER, "end-linear-solve",
                 "status = failed set scaling vectors");

      return (cvls_mem->last_flag);
    }

    /* If solver is iterative and does not support scaling vectors, update the
     tolerance in an attempt to account for weight vector.  We make the
     following assumptions:
       1. w_i = w_mean, for i=0,...,n-1 (i.e. the weights are homogeneous)
       2. the linear solver uses a basic 2-norm to measure convergence
     Hence (using the notation from sunlinsol_spgmr.h, with S = diag(w)),
           || bbar - Abar xbar ||_2 < tol
       <=> || S b - S A x ||_2 < tol
       <=> || S (b - A x) ||_2 < tol
       <=> \sum_{i=0}^{n-1} (w_i (b - A x)_i)^2 < tol^2
       <=> w_mean^2 \sum_{i=0}^{n-1} (b - A x_i)^2 < tol^2
       <=> \sum_{i=0}^{n-1} (b - A x_i)^2 < tol^2 / w_mean^2
       <=> || b - A x ||_2 < tol / w_mean
     So we compute w_mean = ||w||_RMS = ||w||_2 and scale the desired tolerance accordingly. */
  }
  else if (cvls_mem->iterative)
  {
    N_VConst(ONE, cvls_mem->x);
    w_mean = N_VWrmsNorm(weight, cvls_mem->x);
    delta /= w_mean;
  }

  /* Set initial guess x = 0 to LS */
  N_VConst(ZERO, cvls_mem->x);

  /* Set zero initial guess flag */
  retval = SUNLinSolSetZeroGuess(cvls_mem->LS, SUNTRUE);
  if (retval != SUN_SUCCESS)
  {
    SUNLogInfo(CV_LOGGER, "end-linear-solve", "status = failed set zero guess",
               "");
    return (-1);
  }

  /* Store previous nps value in nps_inc */
  nps_inc = cvls_mem->nps;

  /* If a user-provided jtsetup routine is supplied, call that here */
  if (cvls_mem->jtsetup)
  {
    cvls_mem->last_flag = cvls_mem->jtsetup(cv_mem->cv_tn, ynow, fnow,
                                            cvls_mem->jt_data);
    cvls_mem->njtsetup++;
    if (cvls_mem->last_flag != 0)
    {
      cvProcessError(cv_mem, retval, __LINE__, __func__, __FILE__,
                     MSG_LS_JTSETUP_FAILED);

      SUNLogInfo(CV_LOGGER, "end-linear-solve", "status = failed J-times setup",
                 "");
      return (cvls_mem->last_flag);
    }
  }

  /* Call solver, and copy x to b */
  retval = SUNLinSolSolve(cvls_mem->LS, cvls_mem->A, cvls_mem->x, b, delta);
  N_VScale(ONE, cvls_mem->x, b);

  /* If using a direct or matrix-iterative solver, BDF method, and gamma has changed,
     scale the correction to account for change in gamma */
  if (cvls_mem->scalesol && cv_mem->cv_gamrat != ONE)
  {
    N_VScale(TWO / (ONE + cv_mem->cv_gamrat), b, b);
  }

  /* Retrieve statistics from iterative linear solvers */
  resnorm = ZERO;
  nli_inc = 0;
  if (cvls_mem->iterative)
  {
    if (cvls_mem->LS->ops->resnorm) resnorm = SUNLinSolResNorm(cvls_mem->LS);
    if (cvls_mem->LS->ops->numiters)
    {
      nli_inc = SUNLinSolNumIters(cvls_mem->LS);
    }
  }

  /* Increment counters nli and ncfl */
  cvls_mem->nli += nli_inc;
  if (retval != SUN_SUCCESS) { cvls_mem->ncfl++; }

  /* Interpret solver return value  */
  cvls_mem->last_flag = retval;

  SUNLogInfoIf(retval == SUN_SUCCESS, CV_LOGGER, "end-linear-solve",
               "status = success, iters = %i, p-solves = %i, res-norm = %.16g",
               nli_inc, (int)(cvls_mem->nps - nps_inc), resnorm);
  SUNLogInfoIf(retval != SUN_SUCCESS, CV_LOGGER,
               "end-linear-solve", "status = failed, retval = %i, iters = %i, p-solves = %i, res-norm = %.16g",
               retval, nli_inc, (int)(cvls_mem->nps - nps_inc), resnorm);

  switch (retval)
  {
  case SUN_SUCCESS: return (0); break;
  case SUNLS_RES_REDUCED:
    /* allow reduction but not solution on first Newton iteration,
       otherwise return with a recoverable failure */
    if (curiter == 0) { return (0); }
    else { return (1); }
    break;
  case SUNLS_CONV_FAIL:
  case SUNLS_ATIMES_FAIL_REC:
  case SUNLS_PSOLVE_FAIL_REC:
  case SUNLS_PACKAGE_FAIL_REC:
  case SUNLS_QRFACT_FAIL:
  case SUNLS_LUFACT_FAIL: return (1); break;
  case SUN_ERR_ARG_CORRUPT:
  case SUN_ERR_ARG_INCOMPATIBLE:
  case SUN_ERR_MEM_FAIL:
  case SUNLS_GS_FAIL:
  case SUNLS_QRSOL_FAIL: return (-1); break;
  case SUN_ERR_EXT_FAIL:
    cvProcessError(cv_mem, SUN_ERR_EXT_FAIL, __LINE__, __func__, __FILE__,
                   "Failure in SUNLinSol external package");
    return (-1);
    break;
  case SUNLS_ATIMES_FAIL_UNREC:
    cvProcessError(cv_mem, SUNLS_ATIMES_FAIL_UNREC, __LINE__, __func__,
                   __FILE__, MSG_LS_JTIMES_FAILED);
    return (-1);
    break;
  case SUNLS_PSOLVE_FAIL_UNREC:
    cvProcessError(cv_mem, SUNLS_PSOLVE_FAIL_UNREC, __LINE__, __func__,
                   __FILE__, MSG_LS_PSOLVE_FAILED);
    return (-1);
    break;
  }

  return (0);
}